

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestingUtility.h
# Opt level: O0

bool __thiscall
BaseParticleFixture<pica::Particle<(pica::Dimension)2>>::
eqParticles_<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>>::ParticleRef,pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>>::ParticleRef>
          (BaseParticleFixture<pica::Particle<(pica::Dimension)2>_> *this,ParticleRef a,
          ParticleRef b)

{
  bool bVar1;
  MassType MVar2;
  MassType MVar3;
  ConstParticleRef *pCVar4;
  ChargeType CVar5;
  FactorType FVar6;
  FactorType FVar7;
  ConstParticleRef *in_stack_ffffffffffffff80;
  bool local_59;
  Vector3<double> local_58;
  ConstParticleRef *in_stack_ffffffffffffffd0;
  PositionType local_28;
  PositionType local_18;
  
  pCVar4 = (ConstParticleRef *)&stack0x00000008;
  local_18 = pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>::ConstParticleRef::
             getPosition(pCVar4);
  local_28 = pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>::ConstParticleRef::
             getPosition(pCVar4);
  bVar1 = pica::operator==(&local_18,&local_28);
  local_59 = false;
  if (bVar1) {
    pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>::ConstParticleRef::getMomentum
              (in_stack_ffffffffffffffd0);
    pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>::ConstParticleRef::getMomentum
              (in_stack_ffffffffffffffd0);
    bVar1 = pica::operator==((Vector3<double> *)&stack0xffffffffffffffc0,&local_58);
    local_59 = false;
    if (bVar1) {
      MVar2 = pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>::ConstParticleRef::getMass
                        (in_stack_ffffffffffffff80);
      MVar3 = pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>::ConstParticleRef::getMass
                        (in_stack_ffffffffffffff80);
      local_59 = false;
      if ((MVar2 == MVar3) && (!NAN(MVar2) && !NAN(MVar3))) {
        pCVar4 = (ConstParticleRef *)
                 pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>::ConstParticleRef::
                 getCharge(in_stack_ffffffffffffff80);
        CVar5 = pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>::ConstParticleRef::
                getCharge(pCVar4);
        local_59 = false;
        if (((double)pCVar4 == CVar5) && (!NAN((double)pCVar4) && !NAN(CVar5))) {
          FVar6 = pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>::ConstParticleRef::
                  getFactor((ConstParticleRef *)0x21406f);
          FVar7 = pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>::ConstParticleRef::
                  getFactor((ConstParticleRef *)0x21407e);
          local_59 = FVar6 == FVar7;
        }
      }
    }
  }
  return local_59;
}

Assistant:

bool eqParticles_(ConstParticleRef1 a, ConstParticleRef2 b) const
    {
        return (a.getPosition() == b.getPosition()) &&
            (a.getMomentum() == b.getMomentum()) &&
            (a.getMass() == b.getMass()) &&
            (a.getCharge() == b.getCharge()) &&
            (a.getFactor() == b.getFactor());
    }